

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void * __thiscall Js::FunctionProxy::GetAuxPtrWithLock(FunctionProxy *this,AuxPointerType e)

{
  AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> **ppAVar1;
  ScriptContext *this_00;
  ThreadContext *this_01;
  CriticalSection *cs;
  AutoCriticalSection local_28;
  AutoCriticalSection autoCS;
  AuxPointerType e_local;
  FunctionProxy *this_local;
  
  autoCS.cs._7_1_ = e;
  ppAVar1 = Memory::WriteBarrierPtr::operator_cast_to_AuxPtrs__((WriteBarrierPtr *)&this->auxPtrs);
  if (*ppAVar1 == (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)0x0) {
    this_local = (FunctionProxy *)0x0;
  }
  else {
    this_00 = GetScriptContext(this);
    this_01 = ScriptContext::GetThreadContext(this_00);
    cs = ThreadContext::GetFunctionBodyLock(this_01);
    AutoCriticalSection::AutoCriticalSection(&local_28,cs);
    this_local = (FunctionProxy *)
                 AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType>::GetAuxPtr
                           (this,autoCS.cs._7_1_);
    AutoCriticalSection::~AutoCriticalSection(&local_28);
  }
  return this_local;
}

Assistant:

void* FunctionProxy::GetAuxPtrWithLock(AuxPointerType e) const
    {
        if (this->auxPtrs == nullptr)
        {
            return nullptr;
        }

#if DBG && ENABLE_NATIVE_CODEGEN && defined(_WIN32)
        // the lock for work item queue should not be locked while accessing AuxPtrs in background thread
        auto jobProcessor = this->GetScriptContext()->GetThreadContext()->GetJobProcessor();
        auto jobProcessorCS = jobProcessor->GetCriticalSection();

        // ->IsLocked is not supported on xplat
        Assert(!jobProcessorCS || !jobProcessor->ProcessesInBackground() || !jobProcessorCS->IsLocked());
#endif

        AutoCriticalSection autoCS(this->GetScriptContext()->GetThreadContext()->GetFunctionBodyLock());
        return AuxPtrsT::GetAuxPtr(this, e);
    }